

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O3

FileTypeEnum
cmsys::SystemTools::DetectFileType(char *filename,unsigned_long length,double percent_bin)

{
  byte bVar1;
  bool bVar2;
  FILE *__stream;
  void *__ptr;
  size_t sVar3;
  size_t sVar4;
  FileTypeEnum FVar5;
  FileTypeEnum FVar6;
  long lVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  allocator local_59;
  double local_58;
  string local_50;
  
  FVar5 = FileTypeUnknown;
  FVar6 = FileTypeUnknown;
  if ((filename != (char *)0x0) && (FVar6 = FVar5, 0.0 <= percent_bin)) {
    local_58 = percent_bin;
    std::__cxx11::string::string((string *)&local_50,filename,&local_59);
    bVar2 = FileIsDirectory(&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if (!bVar2) {
      std::__cxx11::string::string((string *)&local_50,filename,&local_59);
      __stream = fopen64(local_50._M_dataplus._M_p,"rb");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if (__stream != (FILE *)0x0) {
        __ptr = operator_new__(length);
        sVar3 = fread(__ptr,1,length,__stream);
        fclose(__stream);
        if (sVar3 == 0) {
          operator_delete__(__ptr);
        }
        else {
          sVar4 = 0;
          lVar7 = 0;
          do {
            bVar1 = *(byte *)((long)__ptr + sVar4);
            if (('\x1f' < (char)bVar1) || ((bVar1 < 0xe && ((0x2600U >> (bVar1 & 0x1f) & 1) != 0))))
            {
              lVar7 = lVar7 + 1;
            }
            sVar4 = sVar4 + 1;
          } while (sVar3 != sVar4);
          operator_delete__(__ptr);
          lVar7 = sVar3 - lVar7;
          auVar9._8_4_ = (int)((ulong)lVar7 >> 0x20);
          auVar9._0_8_ = lVar7;
          auVar9._12_4_ = 0x45300000;
          auVar8._8_4_ = (int)(sVar3 >> 0x20);
          auVar8._0_8_ = sVar3;
          auVar8._12_4_ = 0x45300000;
          FVar6 = (((auVar9._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0)) /
                   ((auVar8._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)sVar3) - 4503599627370496.0)) < local_58) +
                  FileTypeBinary;
        }
      }
    }
  }
  return FVar6;
}

Assistant:

SystemTools::FileTypeEnum SystemTools::DetectFileType(const char* filename,
                                                      unsigned long length,
                                                      double percent_bin)
{
  if (!filename || percent_bin < 0) {
    return SystemTools::FileTypeUnknown;
  }

  if (SystemTools::FileIsDirectory(filename)) {
    return SystemTools::FileTypeUnknown;
  }

  FILE* fp = Fopen(filename, "rb");
  if (!fp) {
    return SystemTools::FileTypeUnknown;
  }

  // Allocate buffer and read bytes

  unsigned char* buffer = new unsigned char[length];
  size_t read_length = fread(buffer, 1, length, fp);
  fclose(fp);
  if (read_length == 0) {
    delete[] buffer;
    return SystemTools::FileTypeUnknown;
  }

  // Loop over contents and count

  size_t text_count = 0;

  const unsigned char* ptr = buffer;
  const unsigned char* buffer_end = buffer + read_length;

  while (ptr != buffer_end) {
    if ((*ptr >= 0x20 && *ptr <= 0x7F) || *ptr == '\n' || *ptr == '\r' ||
        *ptr == '\t') {
      text_count++;
    }
    ptr++;
  }

  delete[] buffer;

  double current_percent_bin = (static_cast<double>(read_length - text_count) /
                                static_cast<double>(read_length));

  if (current_percent_bin >= percent_bin) {
    return SystemTools::FileTypeBinary;
  }

  return SystemTools::FileTypeText;
}